

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::DeleteShader::DeleteShader
          (DeleteShader *this,SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *shader,bool useSync,
          bool serverSync)

{
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_40 [2];
  undefined1 local_1a;
  undefined1 local_19;
  bool serverSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *pSStack_18;
  bool useSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *shader_local;
  DeleteShader *this_local;
  
  local_1a = serverSync;
  local_19 = useSync;
  pSStack_18 = shader;
  shader_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)this;
  Operation::Operation(&this->super_Operation,"DeleteShader",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__DeleteShader_03277818;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr(&this->m_shader,shader);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>
            (local_40,&this->m_shader);
  Operation::modifyGLObject(&this->super_Operation,local_40);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(local_40);
  return;
}

Assistant:

DeleteShader::DeleteShader (SharedPtr<Shader> shader, bool useSync, bool serverSync)
	: Operation	("DeleteShader", useSync, serverSync)
	, m_shader	(shader)
{
	modifyGLObject(SharedPtr<Object>(m_shader));
}